

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

ostream * operator<<(ostream *os,NodeUID *uid)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"{");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,uid->nid);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,uid->rid);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,uid->tid);
  poVar1 = std::operator<<(poVar1,"}");
  return poVar1;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const cpprofiler::NodeUID& uid) {
	return os << "{" << uid.nid << ", " << uid.rid << ", " << uid.tid << "}";
}